

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O3

void __thiscall
pstore::command_line::details::values::
apply<pstore::command_line::opt<endian,pstore::command_line::parser<endian,void>>>
          (values *this,opt<endian,_pstore::command_line::parser<endian,_void>_> *o)

{
  size_t sVar1;
  string *description;
  long lVar2;
  
  sVar1 = (this->values_).elements_;
  if (sVar1 != 0) {
    description = &((this->values_).buffer_)->description;
    lVar2 = sVar1 * 0x48;
    do {
      parser_base::add_literal_option
                (&(o->parser_).super_parser_base,(string *)((long)&description[-2].field_2 + 8),
                 *(int *)((long)&description[-1].field_2 + 8),description);
      description = (string *)&description[2]._M_string_length;
      lVar2 = lVar2 + -0x48;
    } while (lVar2 != 0);
  }
  return;
}

Assistant:

const_iterator end () const noexcept { return const_iterator{buffer_ + elements_}; }